

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bilateral_filter.hpp
# Opt level: O2

void MeanField::Filtering::applyBilateralKernelY
               (float *input,float *output,uchar *rgb,float *spatialKernel,float *intensityKernel,
               float spatialSD,float intensitySD,int dim,int x,int y,int W,int H)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  float *pfVar5;
  int i;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar4 = 0;
  uVar7 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar7 = (ulong)(uint)dim << 2;
  }
  uVar10 = 0;
  if (0 < dim) {
    uVar10 = (ulong)(uint)dim;
  }
  pvVar2 = operator_new__(uVar7);
  for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)pvVar2 + uVar4 * 4) = 0;
  }
  fVar11 = spatialSD;
  if (spatialSD <= intensitySD) {
    fVar11 = intensitySD;
  }
  lVar3 = (long)W;
  iVar9 = W * y + x;
  lVar1 = (long)iVar9 * 3;
  lVar8 = (long)-(int)fVar11;
  pfVar5 = input + ((y + lVar8) * lVar3 + (long)x) * (long)dim;
  fVar12 = 0.0;
  for (; lVar8 <= (int)fVar11; lVar8 = lVar8 + 1) {
    lVar6 = lVar8 + y;
    if (lVar6 < H && -1 < lVar6) {
      fVar15 = (float)(int)lVar8;
      fVar13 = 1.0;
      if ((-spatialSD <= fVar15) && (fVar13 = 1.0, fVar15 <= spatialSD)) {
        fVar13 = spatialKernel[(int)ABS(fVar15)];
      }
      fVar14 = 1.0;
      if ((-intensitySD <= fVar15) && (fVar14 = 1.0, fVar15 <= intensitySD)) {
        lVar6 = (lVar6 * lVar3 + (long)x) * 3;
        fVar14 = intensityKernel
                 [(int)ABS((float)(*(ushort *)(rgb + lVar6) & 0xff) -
                           (float)(*(ushort *)(rgb + lVar1) & 0xff))] *
                 intensityKernel
                 [(int)ABS((float)(byte)(*(ushort *)(rgb + lVar6) >> 8) -
                           (float)(byte)(*(ushort *)(rgb + lVar1) >> 8))] *
                 intensityKernel[(int)ABS((float)rgb[lVar6 + 2] - (float)rgb[lVar1 + 2])];
      }
      for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
        *(float *)((long)pvVar2 + uVar7 * 4) =
             pfVar5[uVar7] * fVar13 * fVar14 + *(float *)((long)pvVar2 + uVar7 * 4);
      }
      fVar12 = fVar12 + fVar13 * fVar14;
    }
    pfVar5 = pfVar5 + dim * lVar3;
  }
  if (0.0 < fVar12) {
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      output[(long)(iVar9 * dim) + uVar7] = *(float *)((long)pvVar2 + uVar7 * 4) / fVar12;
    }
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyBilateralKernelY(const float *input, float *output, const unsigned char *rgb, const float *spatialKernel,
                const float *intensityKernel, float spatialSD, float intensitySD, int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = (spatialSD > intensitySD) ? static_cast<int>(spatialSD) : static_cast<int>(intensitySD);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                int pixelIdx = 3 * (y*W + x);
                int neighPixelIdx = 3 * (idx*W + x);

                float spatialFactor = 1.0;
                if (r >= -spatialSD && r <= spatialSD) {
                    spatialFactor = spatialKernel[static_cast<int>(fabs(static_cast<float>(r)))];
                }

                float intensityFactor = 1.0;
                if (r >= -intensitySD && r <= intensitySD) {
                    intensityFactor = intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx]) - static_cast<float>(rgb[pixelIdx])))] *//R
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 1]) - static_cast<float>(rgb[pixelIdx + 1])))] *//G
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 2]) - static_cast<float>(rgb[pixelIdx + 2])))];//B
                }

                normaliser += spatialFactor * intensityFactor;
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * spatialFactor*intensityFactor;
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }

            delete[] channelSums;
        }